

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::FboColorTexCubeArrayCase::render
          (FboColorTexCubeArrayCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  ostringstream *poVar1;
  deUint32 framebuffer;
  undefined1 auVar2 [16];
  bool bVar3;
  int i;
  deUint32 dVar4;
  uint uVar5;
  DataType DVar6;
  ContextType type;
  GLSLVersion glslVersion;
  deUint32 program;
  int iVar7;
  int height;
  Context *pCVar8;
  TransferFormat TVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  CubeFace face;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  deUint32 tex;
  Surface *local_5e0;
  Vec4 retVal;
  deUint32 tmpTex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  TextureFormat texFmt;
  vector<int,_std::allocator<int>_> order;
  Vec4 local_578;
  Vec3 p0;
  void *local_540;
  Random rnd;
  TextureFormatInfo fmtInfo;
  Vector<float,_4> res;
  ios_base local_470 [264];
  TextureCubeArrayShader arrayTexShader;
  Texture2DShader texToFboShader;
  
  local_5e0 = (Surface *)
              ((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  dVar4 = deStringHash((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar5 = tcu::CommandLine::getBaseSeed
                    (((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                      super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  deRandom_init(&rnd.m_rnd,dVar4 ^ uVar5 ^ 0xed607a89);
  texFmt = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  arrayTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  arrayTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  arrayTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  res.m_data[0] = 5.60519e-44;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&arrayTexShader,(iterator)0x0,
             (DataType *)&res);
  DVar6 = FboTestUtil::getFragmentOutputType(&texFmt);
  res.m_data[2] = fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2];
  res.m_data[3] = fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3];
  res.m_data[1] = fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1];
  res.m_data[0] = fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0];
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,(DataTypes *)&arrayTexShader,DVar6,&res,&fmtInfo.valueMin);
  if (arrayTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0)
  {
    operator_delete(arrayTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)arrayTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)arrayTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  DVar6 = glu::getSamplerCubeArrayType(texFmt);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  FboTestUtil::TextureCubeArrayShader::TextureCubeArrayShader
            (&arrayTexShader,DVar6,TYPE_FLOAT_VEC4,glslVersion);
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar4 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&texToFboShader);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar8->_vptr_Context[0x75])(pCVar8,&arrayTexShader);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,pCVar8,dVar4);
  FboTestUtil::TextureCubeArrayShader::setTexScaleBias
            (&arrayTexShader,&fmtInfo.lookupScale,&fmtInfo.lookupBias);
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar9 = glu::getTransferFormat(texFmt);
  bVar3 = glu::isGLInternalColorFormatFilterable((this->super_FboColorbufferCase).m_format);
  poVar1 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = local_5e0;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating a cube map array texture (",0x23);
  std::ostream::operator<<(poVar1,*(int *)&(this->super_FboColorbufferCase).field_0x8c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
  std::ostream::operator<<(poVar1,*(int *)&this->field_0x90);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", depth: ",9);
  std::ostream::operator<<(poVar1,*(int *)&this->field_0x94);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_470);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x8072,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2801,bVar3 | 0x2600);
  sglr::ContextWrapper::glTexParameteri(this_00,0x9009,0x2800,bVar3 | 0x2600);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x9009,0,(this->super_FboColorbufferCase).m_format,
             *(int *)&(this->super_FboColorbufferCase).field_0x8c,*(int *)&this->field_0x90,
             *(int *)&this->field_0x94,0,TVar9.format,TVar9.dataType,(void *)0x0);
  poVar1 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = local_5e0;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating a framebuffer object for each layer-face",0x31);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_470);
  if (0 < *(int *)&this->field_0x94) {
    iVar13 = 0;
    do {
      sglr::ContextWrapper::glGenFramebuffers(this_00,1,(deUint32 *)&res);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,(deUint32)res.m_data[0]);
      sglr::ContextWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce0,tex,0,iVar13);
      FboTestCase::checkError((FboTestCase *)this);
      FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
      if (fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&fbos,
                   (iterator)
                   fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&res);
      }
      else {
        *fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = (uint)res.m_data[0];
        fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < *(int *)&this->field_0x94);
  }
  poVar1 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = local_5e0;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering test images to layer-faces in randomized order",0x38);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_470);
  std::vector<int,_std::allocator<int>_>::vector
            (&order,(long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&res);
  auVar2 = _DAT_00942940;
  if ((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    lVar10 = (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    lVar11 = lVar10 + -1;
    auVar15._8_4_ = (int)lVar11;
    auVar15._0_8_ = lVar11;
    auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar15 = auVar15 ^ _DAT_00942940;
    auVar16 = _DAT_00942880;
    do {
      auVar17 = auVar16 ^ auVar2;
      if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                  auVar15._4_4_ < auVar17._4_4_) & 1)) {
        order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar12] = (int)uVar12;
      }
      if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
          auVar17._12_4_ <= auVar15._12_4_) {
        order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar12 + 1] = (int)uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar11 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar11 + 2;
    } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar12);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  if (order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      != order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    uVar12 = 0;
    local_5e0 = dst;
    do {
      iVar13 = order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar12];
      tmpTex = 0;
      framebuffer = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar13];
      p0.m_data._0_8_ = glu::mapGLTransferFormat(0x1908,0x1401);
      tcu::TextureLevel::TextureLevel((TextureLevel *)&res,(TextureFormat *)&p0,0x80,0x80,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&res);
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      retVal.m_data[0] = fVar14;
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      retVal.m_data[1] = fVar14;
      retVal.m_data[2] = deRandom_getFloat(&rnd.m_rnd);
      retVal.m_data[3] = 1.0;
      local_578.m_data = (float  [4])ZEXT416(0);
      tcu::fillWithGrid((PixelBufferAccess *)&p0,8,&retVal,&local_578);
      sglr::ContextWrapper::glGenTextures(this_00,1,&tmpTex);
      sglr::ContextWrapper::glBindTexture(this_00,0xde1,tmpTex);
      sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
      sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
      sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
      sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&res);
      sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,local_540)
      ;
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,framebuffer);
      sglr::ContextWrapper::glViewport
                (this_00,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,
                 *(int *)&this->field_0x90);
      pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
      p0.m_data[0] = -1.0;
      p0.m_data[1] = -1.0;
      p0.m_data[2] = 0.0;
      retVal.m_data[0] = 1.0;
      retVal.m_data[1] = 1.0;
      retVal.m_data[2] = 0.0;
      sglr::drawQuad(pCVar8,dVar4,&p0,(Vec3 *)&retVal);
      FboTestCase::checkError((FboTestCase *)this);
      p0.m_data[1] = (float)(uVar12 >> 1) + -1.0;
      p0.m_data[0] = (float)(int)(((uint)uVar12 & 1) - 1);
      p0.m_data[2] = 0.0;
      local_578.m_data._0_12_ = ZEXT812(0x3f8000003f800000);
      retVal.m_data[2] = 0.0;
      retVal.m_data[0] = 0.0;
      retVal.m_data[1] = 0.0;
      lVar10 = 0;
      do {
        retVal.m_data[lVar10] = p0.m_data[lVar10] + local_578.m_data[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      face = CUBEFACE_LAST;
      if ((uint)(iVar13 % 6) < 6) {
        face = *(CubeFace *)(&DAT_009701cc + (ulong)(uint)(iVar13 % 6) * 4);
      }
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
      iVar7 = sglr::ContextWrapper::getWidth(this_00);
      height = sglr::ContextWrapper::getHeight(this_00);
      sglr::ContextWrapper::glViewport(this_00,0,0,iVar7,height);
      sglr::ContextWrapper::glActiveTexture(this_00,0x84c0);
      sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
      FboTestUtil::TextureCubeArrayShader::setLayer(&arrayTexShader,iVar13 / 6);
      FboTestUtil::TextureCubeArrayShader::setFace(&arrayTexShader,face);
      pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
      FboTestUtil::TextureCubeArrayShader::setUniforms(&arrayTexShader,pCVar8,program);
      pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
      sglr::drawQuad(pCVar8,program,&p0,(Vec3 *)&retVal);
      FboTestCase::checkError((FboTestCase *)this);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&res);
      uVar12 = uVar12 + 1;
      dst = local_5e0;
    } while (uVar12 < (ulong)((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  if (order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar13 = sglr::ContextWrapper::getWidth(this_00);
  iVar7 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar13,iVar7);
  if (fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&arrayTexShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		TestLog&				log					= m_testCtx.getLog();
		de::Random				rnd					(deStringHash(getName()) ^ 0xed607a89 ^ m_testCtx.getCommandLine().getBaseSeed());
		tcu::TextureFormat		texFmt				= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		TextureCubeArrayShader	arrayTexShader		(glu::getSamplerCubeArrayType(texFmt), glu::TYPE_FLOAT_VEC4, glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()));

		deUint32				texToFboShaderID	= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				arrayTexShaderID	= getCurrentContext()->createProgram(&arrayTexShader);

		// Setup textures
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		arrayTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat	transferFmt		= glu::getTransferFormat(texFmt);
			bool				isFilterable	= glu::isGLInternalColorFormatFilterable(m_format);
			const IVec3&		size			= m_texSize;

			log << TestLog::Message
				<< "Creating a cube map array texture ("
				<< size.x() << "x" << size.y()
				<< ", depth: "
				<< size.z() << ")"
				<< TestLog::EndMessage;

			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_format, size.x(), size.y(), size.z(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			log << TestLog::Message << "Creating a framebuffer object for each layer-face" << TestLog::EndMessage;

			// Generate an FBO for each layer-face
			for (int ndx = 0; ndx < m_texSize.z(); ndx++)
			{
				deUint32 layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, tex, 0, ndx);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		log << TestLog::Message << "Rendering test images to layer-faces in randomized order" << TestLog::EndMessage;

		{
			std::vector<int> order(fbos.size());

			for (size_t n = 0; n < order.size(); n++)
				order[n] = (int)n;
			rnd.shuffle(order.begin(), order.end());

			for (size_t ndx = 0; ndx < order.size(); ndx++)
			{
				const int			layerFace	= order[ndx];
				const deUint32		format		= GL_RGBA;
				const deUint32		dataType	= GL_UNSIGNED_BYTE;
				const int			texW		= 128;
				const int			texH		= 128;
				deUint32			tmpTex		= 0;
				const deUint32		fbo			= fbos[layerFace];
				const IVec3&		viewport	= m_texSize;
				tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

				tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

				glGenTextures(1, &tmpTex);
				glBindTexture(GL_TEXTURE_2D, tmpTex);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
				glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

				glBindFramebuffer(GL_FRAMEBUFFER, fbo);
				glViewport(0, 0, viewport.x(), viewport.y());
				sglr::drawQuad(*getCurrentContext(), texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
				checkError();

				// Render to framebuffer
				{
					const Vec3			p0		= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
					const Vec3			p1		= p0 + Vec3(1.0f, 1.0f, 0.0f);
					const int			layer	= layerFace / 6;
					const tcu::CubeFace	face	= getCubeFaceFromNdx(layerFace % 6);

					glBindFramebuffer(GL_FRAMEBUFFER, 0);
					glViewport(0, 0, getWidth(), getHeight());

					glActiveTexture(GL_TEXTURE0);
					glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);

					arrayTexShader.setLayer(layer);
					arrayTexShader.setFace(face);
					arrayTexShader.setUniforms(*getCurrentContext(), arrayTexShaderID);

					sglr::drawQuad(*getCurrentContext(), arrayTexShaderID, p0, p1);
					checkError();
				}
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}